

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O3

void Curl_pp_init(pingpong *pp)

{
  curltime cVar1;
  
  pp->nread_resp = 0;
  cVar1 = Curl_now();
  (pp->response).tv_sec = cVar1.tv_sec;
  (pp->response).tv_usec = cVar1.tv_usec;
  pp->pending_resp = true;
  Curl_dyn_init(&pp->sendbuf,0x10000);
  Curl_dyn_init(&pp->recvbuf,0x10000);
  pp->field_0xa0 = pp->field_0xa0 | 1;
  return;
}

Assistant:

void Curl_pp_init(struct pingpong *pp)
{
  DEBUGASSERT(!pp->initialised);
  pp->nread_resp = 0;
  pp->response = Curl_now(); /* start response time-out now! */
  pp->pending_resp = TRUE;
  Curl_dyn_init(&pp->sendbuf, DYN_PINGPPONG_CMD);
  Curl_dyn_init(&pp->recvbuf, DYN_PINGPPONG_CMD);
  pp->initialised = TRUE;
}